

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlNewProp(void)

{
  int iVar1;
  int iVar2;
  xmlNodePtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlAttrPtr val_02;
  int local_44;
  int n_value;
  xmlChar *value;
  int n_name;
  xmlChar *name;
  int n_node;
  xmlNodePtr node;
  xmlAttrPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 3; name._4_4_ = name._4_4_ + 1) {
    for (value._4_4_ = 0; (int)value._4_4_ < 5; value._4_4_ = value._4_4_ + 1) {
      for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlNodePtr(name._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(value._4_4_,1);
        val_01 = gen_const_xmlChar_ptr(local_44,2);
        val_02 = (xmlAttrPtr)xmlNewProp(val,val_00,val_01);
        desret_xmlAttrPtr(val_02);
        call_tests = call_tests + 1;
        des_xmlNodePtr(name._4_4_,val,0);
        des_const_xmlChar_ptr(value._4_4_,val_00,1);
        des_const_xmlChar_ptr(local_44,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewProp",(ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)name._4_4_);
          printf(" %d",(ulong)value._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlNewProp(void) {
    int test_ret = 0;

    int mem_base;
    xmlAttrPtr ret_val;
    xmlNodePtr node; /* the parent node (optional) */
    int n_node;
    const xmlChar * name; /* the name of the attribute */
    int n_name;
    const xmlChar * value; /* the value of the attribute (optional) */
    int n_value;

    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_value = 0;n_value < gen_nb_const_xmlChar_ptr;n_value++) {
        mem_base = xmlMemBlocks();
        node = gen_xmlNodePtr(n_node, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        value = gen_const_xmlChar_ptr(n_value, 2);

        ret_val = xmlNewProp(node, name, value);
        desret_xmlAttrPtr(ret_val);
        call_tests++;
        des_xmlNodePtr(n_node, node, 0);
        des_const_xmlChar_ptr(n_name, name, 1);
        des_const_xmlChar_ptr(n_value, value, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlNewProp",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_node);
            printf(" %d", n_name);
            printf(" %d", n_value);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}